

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O2

void __thiscall
LinkParser::parseReaction
          (LinkParser *this,Link *link,int type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  InputError *this_00;
  string local_48;
  double local_28;
  double x;
  
  iVar3 = (*(link->super_Element)._vptr_Element[2])(link);
  if (iVar3 == 0) {
    pbVar1 = (tokenList->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar2 = Utilities::parseNumber<double>(pbVar1 + 2,&local_28);
    if (!bVar2) {
      this_00 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_48,(string *)(pbVar1 + 1));
      InputError::InputError(this_00,6,&local_48);
      __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
    }
    if (type == 0) {
      lVar4 = 0xd0;
    }
    else {
      if (type != 1) {
        return;
      }
      lVar4 = 0xd8;
    }
    *(double *)((long)&(link->super_Element)._vptr_Element + lVar4) = local_28;
  }
  return;
}

Assistant:

void LinkParser::parseReaction(Link* link, int type, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - BULK/WALL keyword
    // 1 - link ID
    // 2 - reaction coeff. (1/days)

    // ... cast link to a pipe (only pipe links have reactions)

    if ( link->type() != Link::PIPE ) return;
    Pipe* pipe = static_cast<Pipe*>(link);

    // ... read reaction coeff.

    double x;
    string* tokens = &tokenList[0];
    if ( !Utilities::parseNumber(tokens[2], x) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }

    // ... save reaction coeff.

    if      (type == Link::BULK) pipe->bulkCoeff = x;
    else if (type == Link::WALL) pipe->wallCoeff = x;
}